

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall GEO::geofile::scale_data(geofile *this,double factor)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  iterator i;
  iterator pm_end;
  double factor_local;
  geofile *this_local;
  
  pm_end._M_node._7_1_ = 1;
  make_coherent(this,(bool *)((long)&pm_end._M_node + 7));
  simplify_data(this);
  i = std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::end(&this->points_map);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
       ::begin(&this->points_map);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&i);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_30);
    scale_point(this,&ppVar2->second,factor);
    std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_30,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::scale_data(const double factor)
{
    make_coherent(true);
    simplify_data();
    auto pm_end = points_map.end();
    for (auto i = points_map.begin(); i != pm_end; i++)
    {
        scale_point(i->second, factor);
    }
    return EXIT_SUCCESS;
}